

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseLibraryDeclaration(Parser *this)

{
  bool bVar1;
  element_type *peVar2;
  undefined1 local_80 [32];
  char local_60 [16];
  String local_50;
  undefined1 local_30 [8];
  String libraryName;
  Parser *this_local;
  
  libraryName.field_2._8_8_ = this;
  bVar1 = std::operator!=(&this->m_library,(nullptr_t)0x0);
  if (bVar1) {
    Error<>(this,"Library has already been declared for this script");
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30);
  bVar1 = Accept(this,Library);
  if (bVar1) {
    ParseName_abi_cxx11_(&local_50,this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30,
               &local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_50);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_30);
    if (bVar1) {
      Error<>(this,"Expected valid name after \'library\' keyword");
      local_60[0] = '\x01';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      goto LAB_001511f6;
    }
    Expect(this,NewLine,(char *)0x0);
    peVar2 = std::__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_runtime);
    Runtime::GetLibraryInternal((Runtime *)(local_80 + 0x10),(String *)peVar2);
    std::shared_ptr<Jinx::Impl::Library>::operator=
              (&this->m_library,(shared_ptr<Jinx::Impl::Library> *)(local_80 + 0x10));
    std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
              ((shared_ptr<Jinx::Impl::Library> *)(local_80 + 0x10));
  }
  EmitOpcode(this,Library);
  EmitName(this,(String *)local_30);
  peVar2 = std::__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_runtime);
  Runtime::GetLibraryInternal((Runtime *)local_80,(String *)peVar2);
  std::shared_ptr<Jinx::Impl::Library>::operator=
            (&this->m_library,(shared_ptr<Jinx::Impl::Library> *)local_80);
  std::shared_ptr<Jinx::Impl::Library>::~shared_ptr((shared_ptr<Jinx::Impl::Library> *)local_80);
  local_60[0] = '\0';
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
LAB_001511f6:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30);
  return;
}

Assistant:

inline_t void Parser::ParseLibraryDeclaration()
	{
		if (m_library != nullptr)
		{
			Error("Library has already been declared for this script");
			return;
		}
		String libraryName;
		if (Accept(SymbolType::Library))
		{
			libraryName = ParseName();
			if (libraryName.empty())
			{
				Error("Expected valid name after 'library' keyword");
				return;
			}
			Expect(SymbolType::NewLine);
			m_library = m_runtime->GetLibraryInternal(libraryName);
		}

		// Emit library declaration bytecode
		EmitOpcode(Opcode::Library);
		EmitName(libraryName);

		// Retrieve library interface by name
		m_library = m_runtime->GetLibraryInternal(libraryName);
	}